

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(void)

{
  ImGuiViewportP *this;
  byte local_76;
  char local_75 [21];
  ImGuiViewportP *local_60;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  
  ini_handler.UserData = GImGui;
  local_76 = 0;
  if ((GImGui->Initialized & 1U) == 0) {
    local_76 = GImGui->SettingsLoaded ^ 0xff;
  }
  if ((local_76 & 1) == 0) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1195,"void ImGui::Initialize()");
  }
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)&viewport);
  viewport = (ImGuiViewportP *)0x214ae4;
  ini_handler.TypeName._0_4_ = ImHashStr("Window",0,0);
  ini_handler._8_8_ = WindowSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = WindowSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = WindowSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = WindowSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = WindowSettingsHandler_WriteAll;
  AddSettingsHandler((ImGuiSettingsHandler *)&viewport);
  TableSettingsAddSettingsHandler();
  MemAlloc(0xb8);
  this = (ImGuiViewportP *)operator_new(0xb8);
  ImGuiViewportP::ImGuiViewportP(this);
  local_60 = this;
  ImVector<ImGuiViewportP_*>::push_back
            ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x40a8),&local_60);
  local_75[0] = '\0';
  ImVector<char>::resize((ImVector<char> *)((long)ini_handler.UserData + 0x5668),0xc01,local_75);
  *(undefined1 *)ini_handler.UserData = 1;
  return;
}

Assistant:

void ImGui::Initialize()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsAddSettingsHandler();

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);
    g.TempBuffer.resize(1024 * 3 + 1, 0);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}